

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineDepthTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getCompareOpsDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkCompareOp *quadDepthOps)

{
  ostream *poVar1;
  char *pcVar2;
  int local_1a0;
  int quadNdx;
  ostringstream local_190 [8];
  ostringstream desc;
  VkCompareOp *quadDepthOps_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Draws ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,4);
  std::operator<<(poVar1," quads with depth compare ops: ");
  for (local_1a0 = 0; local_1a0 < 4; local_1a0 = local_1a0 + 1) {
    pcVar2 = ::vk::getCompareOpName(*(VkCompareOp *)(this + (long)local_1a0 * 4));
    poVar1 = std::operator<<((ostream *)local_190,pcVar2);
    poVar1 = std::operator<<(poVar1," at depth ");
    std::ostream::operator<<(poVar1,*(float *)(DepthTest::quadDepths + (long)local_1a0 * 4));
    if (local_1a0 < 3) {
      std::operator<<((ostream *)local_190,", ");
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string	getCompareOpsDescription (const VkCompareOp quadDepthOps[DepthTest::QUAD_COUNT])
{
	std::ostringstream desc;
	desc << "Draws " << DepthTest::QUAD_COUNT << " quads with depth compare ops: ";

	for (int quadNdx = 0; quadNdx < DepthTest::QUAD_COUNT; quadNdx++)
	{
		desc << getCompareOpName(quadDepthOps[quadNdx]) << " at depth " << DepthTest::quadDepths[quadNdx];

		if (quadNdx < DepthTest::QUAD_COUNT - 1)
			desc << ", ";
	}
	return desc.str();
}